

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

Label __thiscall
asmjit::v1_14::BaseAssembler::newNamedLabel
          (BaseAssembler *this,char *name,size_t nameSize,LabelType type,uint32_t parentId)

{
  Error err;
  undefined4 uVar1;
  LabelEntry *in_RAX;
  undefined7 in_register_00000009;
  uint32_t extraout_RDX [2];
  uint32_t extraout_RDX_00 [2];
  uint32_t in_R9D;
  Label LVar2;
  LabelEntry *le;
  
  if (*(CodeHolder **)(name + 0x30) != (CodeHolder *)0x0) {
    le = in_RAX;
    err = CodeHolder::newNamedLabelEntry
                    (*(CodeHolder **)(name + 0x30),&le,(char *)nameSize,
                     CONCAT71(in_register_00000009,type),(LabelType)parentId,in_R9D);
    if (err == 0) {
      uVar1 = *(undefined4 *)&le->field_0xc;
      nameSize = (size_t)extraout_RDX;
      goto LAB_0010dde6;
    }
    BaseEmitter::reportError((BaseEmitter *)name,err,(char *)0x0);
    nameSize = (size_t)extraout_RDX_00;
  }
  uVar1 = 0xffffffff;
LAB_0010dde6:
  *(undefined4 *)&(this->super_BaseEmitter)._vptr_BaseEmitter = 5;
  *(undefined4 *)((long)&(this->super_BaseEmitter)._vptr_BaseEmitter + 4) = uVar1;
  (this->super_BaseEmitter)._emitterType = kNone;
  (this->super_BaseEmitter)._emitterFlags = kNone;
  (this->super_BaseEmitter)._instructionAlignment = '\0';
  (this->super_BaseEmitter)._reservedBaseEmitter = '\0';
  (this->super_BaseEmitter)._validationFlags = kNone;
  LVar2.super_Operand.super_Operand_._data[0] = (uint32_t)nameSize;
  LVar2.super_Operand.super_Operand_._data[1] = SUB84(nameSize,4);
  LVar2.super_Operand.super_Operand_._0_8_ = this;
  return (Label)LVar2.super_Operand.super_Operand_;
}

Assistant:

Label BaseAssembler::newNamedLabel(const char* name, size_t nameSize, LabelType type, uint32_t parentId) {
  uint32_t labelId = Globals::kInvalidId;
  if (ASMJIT_LIKELY(_code)) {
    LabelEntry* le;
    Error err = _code->newNamedLabelEntry(&le, name, nameSize, type, parentId);
    if (ASMJIT_UNLIKELY(err))
      reportError(err);
    else
      labelId = le->id();
  }
  return Label(labelId);
}